

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Constant<float>::doEvaluate
          (IVal *__return_storage_ptr__,Constant<float> *this,EvalContext *param_1)

{
  EvalContext *param_1_local;
  Constant<float> *this_local;
  
  makeIVal<float>(__return_storage_ptr__,&this->m_value);
  return __return_storage_ptr__;
}

Assistant:

IVal	doEvaluate		(const EvalContext&) const	{ return makeIVal(m_value); }